

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O3

void __thiscall
Js::FunctionExecutionStateMachine::TryTransitionToNextInterpreterExecutionMode
          (FunctionExecutionStateMachine *this)

{
  code *pcVar1;
  ExecutionMode EVar2;
  bool bVar3;
  ExecutionState state;
  undefined4 *puVar4;
  FunctionExecutionStateMachine *this_00;
  
  EVar2 = StateToMode(this,this->executionState);
  VerifyExecutionMode(this,EVar2);
  if (ProfilingInterpreter < EVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x26a,"(IsInterpreterExecutionMode())",
                                "IsInterpreterExecutionMode()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  TryTransitionToNextExecutionMode(this);
  this_00 = this;
  EVar2 = GetInterpreterExecutionMode(this,false);
  state = ModeToState(this_00,EVar2);
  EVar2 = StateToMode(this_00,state);
  VerifyExecutionMode(this,EVar2);
  this->executionState = state;
  return;
}

Assistant:

void FunctionExecutionStateMachine::TryTransitionToNextInterpreterExecutionMode()
    {
        Assert(IsInterpreterExecutionMode());

        TryTransitionToNextExecutionMode();
        SetExecutionState(ModeToState(GetInterpreterExecutionMode(false)));
    }